

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall vm::VM::Tstore<double>(VM *this)

{
  int_t addr_00;
  double_t value_00;
  int_t addr;
  double_t value;
  VM *this_local;
  
  value_00 = POP<double>(this);
  addr_00 = POP<int>(this);
  WRITE<double>(this,addr_00,value_00);
  return;
}

Assistant:

void VM::Tstore() {
    auto value = POP<T>();
    auto addr = POP<addr_t>();
    WRITE(addr, value);
}